

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68000_move_fr_sr(m68k_info *info)

{
  m68k_info *info_00;
  cs_m68k *ext;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  m68k_info *in_stack_fffffffffffffff0;
  
  info_00 = (m68k_info *)
            build_init_op(in_stack_fffffffffffffff0,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                          (int)in_stack_ffffffffffffffe8,
                          (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  (info_00->extension).operands[0].field_0.reg_pair.reg_1 = M68K_REG_INVALID;
  *(undefined4 *)&info_00->code = 0x1a;
  get_ea_mode_op(info_00,(cs_m68k_op *)&(info_00->extension).operands[0].mem,
                 (uint)((ulong)info_00 >> 0x20),(uint)info_00);
  return;
}

Assistant:

static void d68000_move_fr_sr(m68k_info *info)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, M68K_INS_MOVE, 2, 2);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->address_mode = M68K_AM_NONE;
	op0->reg = M68K_REG_SR;

	get_ea_mode_op(info, op1, info->ir, 2);
}